

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *curname,string *subname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *subname_local;
  string *curname_local;
  ExcludesError *this_local;
  
  local_20 = subname;
  subname_local = curname;
  curname_local = (string *)this;
  ::std::operator+(&local_60,curname," excludes ");
  ::std::operator+(&local_40,&local_60,subname);
  ExcludesError(this,&local_40,ExcludesError);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}